

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this,int value)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  DictionaryStats *this_01;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar1;
  Type *pTVar2;
  bool bVar3;
  undefined1 local_40 [8];
  EditingIterator iter;
  
  local_40 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_40;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    bVar1 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_40);
    if (!bVar1) {
      return;
    }
    pTVar2 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    buffer = iter.super_Iterator.list;
    bVar1 = false;
  } while (value < pTVar2->value);
  if (pTVar2->value == value) {
    this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
    UnlinkCurrentNode((EditingIterator *)local_40);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_00,buffer,0x20);
    this_01 = this->stats;
    if (this_01 != (DictionaryStats *)0x0) {
      if (bVar3) {
        bVar1 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_40);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      DictionaryStats::Remove(this_01,bVar1);
    }
  }
  return;
}

Assistant:

void Clear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }